

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ActionResultHolder<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_> *
testing::internal::
ActionResultHolder<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>::
PerformAction<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>(unsigned_int)>
          (Action<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
           *action,ArgumentTuple *args)

{
  ActionResultHolder<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  *pAVar1;
  Result local_38;
  _Head_base<0UL,_unsigned_int,_false> local_1c;
  
  pAVar1 = (ActionResultHolder<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
            *)operator_new(0x20);
  local_1c._M_head_impl =
       (args->super__Tuple_impl<0UL,_unsigned_int>).super__Head_base<0UL,_unsigned_int,_false>.
       _M_head_impl;
  Action<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  ::Perform(&local_38,action,(ArgumentTuple *)&local_1c);
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__ActionResultHolder_00321e18;
  (pAVar1->result_).value_.
  super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pAVar1->result_).value_.
  super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pAVar1->result_).value_.
  super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }